

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

void ranges::detail::
     final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,less *pred,
               identity *proj)

{
  int iVar1;
  difference_type dVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  identity *proj_local;
  less *pred_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  pred_local = (less *)last._M_current;
  last_local = first;
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &pred_local,&last_local);
  iVar1 = introsort_threshold();
  _Var3 = last_local;
  if (iVar1 < dVar2) {
    iVar1 = introsort_threshold();
    last_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&last_local,(long)iVar1);
    insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
              (_Var3,last_00,pred,proj);
    iVar1 = introsort_threshold();
    _Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (&last_local,(long)iVar1);
    unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
              (_Var3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)pred_local,
               pred,proj);
  }
  else {
    insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
              (last_local,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)pred_local,pred,
               proj);
  }
  return;
}

Assistant:

inline void final_insertion_sort(I first, I last, C & pred, P & proj)
        {
            if(last - first > detail::introsort_threshold())
            {
                detail::insertion_sort(
                    first, first + detail::introsort_threshold(), pred, proj);
                detail::unguarded_insertion_sort(
                    first + detail::introsort_threshold(), last, pred, proj);
            }
            else
                detail::insertion_sort(first, last, pred, proj);
        }